

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_dpb.c
# Opt level: O0

void free_storable_picture(H264_DecCtx_t *p_Dec,H264_StorePic_t *p)

{
  H264_StorePic_t *p_local;
  H264_DecCtx_t *p_Dec_local;
  
  if (p != (H264_StorePic_t *)0x0) {
    if ((p->mem_malloc_type == Mem_Malloc) || (p->mem_malloc_type == Mem_Clone)) {
      free_dpb_mark(p_Dec,p->mem_mark,p->structure);
    }
    if (p->mem_malloc_type == Mem_TopOnly) {
      free_dpb_mark(p_Dec,p->mem_mark,1);
    }
    if (p->mem_malloc_type == Mem_BotOnly) {
      free_dpb_mark(p_Dec,p->mem_mark,2);
    }
    mpp_mem_pool_put_f("free_storable_picture",p_Dec->p_Vid->pic_st,p);
  }
  return;
}

Assistant:

void free_storable_picture(H264_DecCtx_t *p_Dec, H264_StorePic_t *p)
{
    if (p) {
        if (p->mem_malloc_type == Mem_Malloc
            || p->mem_malloc_type == Mem_Clone) {
            free_dpb_mark(p_Dec, p->mem_mark, p->structure);
        }
        if (p->mem_malloc_type == Mem_TopOnly) {
            free_dpb_mark(p_Dec, p->mem_mark, TOP_FIELD);
        }
        if (p->mem_malloc_type == Mem_BotOnly) {
            free_dpb_mark(p_Dec, p->mem_mark, BOTTOM_FIELD);
        }
        mpp_mem_pool_put(p_Dec->p_Vid->pic_st, p);
    }
}